

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Net::clear(Net *this)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference ppLVar4;
  void *in_RDI;
  int dret;
  Option opt1;
  Layer *layer;
  size_t i;
  undefined1 local_40 [35];
  undefined1 local_1d;
  value_type local_18;
  ulong local_10;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear
            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)0x16986c);
  local_10 = 0;
  while( true ) {
    uVar1 = local_10;
    sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       ((long)in_RDI + 0x40));
    if (sVar3 <= uVar1) break;
    ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                         ((long)in_RDI + 0x40),local_10);
    local_18 = *ppLVar4;
    memcpy(local_40,in_RDI,0x28);
    if ((local_18->support_image_storage & 1U) == 0) {
      local_1d = 0;
    }
    iVar2 = (*local_18->_vptr_Layer[5])(local_18,local_40);
    if (iVar2 != 0) {
      fprintf(_stderr,"layer destroy_pipeline failed");
      fprintf(_stderr,"\n");
    }
    if (local_18 != (value_type)0x0) {
      (*local_18->_vptr_Layer[1])();
    }
    local_10 = local_10 + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x16996a);
  return;
}

Assistant:

void Net::clear()
{
#if NCNN_VULKAN
    destroy_pipeline();
#endif // NCNN_VULKAN

    blobs.clear();
    for (size_t i=0; i<layers.size(); i++)
    {
        Layer* layer = layers[i];

        Option opt1 = opt;
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        delete layer;
    }
    layers.clear();

#if NCNN_VULKAN
    if (weight_vkallocator)
    {
        delete weight_vkallocator;
        weight_vkallocator = 0;
    }
    if (weight_staging_vkallocator)
    {
        delete weight_staging_vkallocator;
        weight_staging_vkallocator = 0;
    }
#endif // NCNN_VULKAN
}